

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,unsigned_long_long value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  char local_48 [32];
  
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar9 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar9 = (uVar9 - (value < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                      (ulong)uVar9 * 8))) + 1;
  uVar10 = (ulong)uVar9;
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar6 = uVar10 + sVar2;
  if (pbVar1->capacity_ < uVar6) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar6);
  }
  pbVar1->size_ = uVar6;
  pcVar7 = local_48 + uVar10;
  uVar6 = value;
  if (99 < value) {
    do {
      value = uVar6 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar6 + (int)value * -100) * 2)
      ;
      pcVar7 = pcVar7 + -2;
      bVar4 = 9999 < uVar6;
      uVar6 = value;
    } while (bVar4);
  }
  pwVar3 = pbVar1->ptr_;
  if (value < 10) {
    bVar8 = (byte)value | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar7[-1] = internal::basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    bVar8 = internal::basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
    lVar5 = -2;
  }
  pcVar7[lVar5] = bVar8;
  if (0 < (int)uVar9) {
    uVar6 = 0;
    do {
      pwVar3[sVar2 + uVar6] = (int)local_48[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }